

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_libapi.cpp
# Opt level: O0

ze_result_t
zetMetricProgrammableGetParamInfoExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,uint32_t *pParameterCount,
          zet_metric_programmable_param_info_exp_t *pParameterInfo)

{
  zet_pfnMetricProgrammableGetParamInfoExp_t p_Var1;
  __pointer_type p_Var2;
  zet_pfnMetricProgrammableGetParamInfoExp_t pfnGetParamInfoExp;
  zet_metric_programmable_param_info_exp_t *pParameterInfo_local;
  uint32_t *pParameterCount_local;
  zet_metric_programmable_exp_handle_t hMetricProgrammable_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zet_dditable_t_*>::load
                       ((atomic<_zet_dditable_t_*> *)(ze_lib::context + 0x18),memory_order_seq_cst);
    p_Var1 = (p_Var2->MetricProgrammableExp).pfnGetParamInfoExp;
    if (p_Var1 == (zet_pfnMetricProgrammableGetParamInfoExp_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hMetricProgrammable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hMetricProgrammable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hMetricProgrammable_local._4_4_ =
           (*p_Var1)(hMetricProgrammable,pParameterCount,pParameterInfo);
    }
  }
  else {
    hMetricProgrammable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hMetricProgrammable_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zetMetricProgrammableGetParamInfoExp(
    zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
    uint32_t* pParameterCount,                      ///< [in,out] count of the parameters to retrieve parameter info.
                                                    ///< if value pParameterCount is greater than count of parameters
                                                    ///< available, then pParameterCount will be updated with count of
                                                    ///< parameters available.
                                                    ///< The count of parameters available can be queried using ::zetMetricProgrammableGetPropertiesExp.
    zet_metric_programmable_param_info_exp_t* pParameterInfo///< [in,out][range(1, *pParameterCount)] array of parameter info.
                                                    ///< if parameterCount is less than the number of parameters available,
                                                    ///< then driver shall only retrieve that number of parameter info.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zet_pfnMetricProgrammableGetParamInfoExp_t pfnGetParamInfoExp = [&result] {
        auto pfnGetParamInfoExp = ze_lib::context->zetDdiTable.load()->MetricProgrammableExp.pfnGetParamInfoExp;
        if( nullptr == pfnGetParamInfoExp ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetParamInfoExp;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetParamInfoExp( hMetricProgrammable, pParameterCount, pParameterInfo );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetParamInfoExp = ze_lib::context->zetDdiTable.load()->MetricProgrammableExp.pfnGetParamInfoExp;
    if( nullptr == pfnGetParamInfoExp ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetParamInfoExp( hMetricProgrammable, pParameterCount, pParameterInfo );
    #endif
}